

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

void __thiscall
icu_63::UCharCharacterIterator::UCharCharacterIterator
          (UCharCharacterIterator *this,ConstChar16Ptr *textPtr,int32_t length,int32_t textBegin,
          int32_t textEnd,int32_t position)

{
  char16_t *pcVar1;
  int32_t local_58;
  int32_t local_54;
  int32_t position_local;
  int32_t textEnd_local;
  int32_t textBegin_local;
  int32_t length_local;
  ConstChar16Ptr *textPtr_local;
  UCharCharacterIterator *this_local;
  
  pcVar1 = ConstChar16Ptr::operator_cast_to_char16_t_(textPtr);
  if (pcVar1 == (char16_t *)0x0) {
    local_58 = 0;
  }
  else {
    local_54 = length;
    if (length < 0) {
      pcVar1 = ConstChar16Ptr::operator_cast_to_char16_t_(textPtr);
      local_54 = u_strlen_63(pcVar1);
    }
    local_58 = local_54;
  }
  CharacterIterator::CharacterIterator
            (&this->super_CharacterIterator,local_58,textBegin,textEnd,position);
  (this->super_CharacterIterator).super_ForwardCharacterIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UCharCharacterIterator_005c2480;
  pcVar1 = ConstChar16Ptr::operator_cast_to_char16_t_(textPtr);
  this->text = pcVar1;
  return;
}

Assistant:

UCharCharacterIterator::UCharCharacterIterator(ConstChar16Ptr textPtr,
                                               int32_t length,
                                               int32_t textBegin,
                                               int32_t textEnd,
                                               int32_t position)
  : CharacterIterator(textPtr != 0 ? (length>=0 ? length : u_strlen(textPtr)) : 0, textBegin, textEnd, position),
  text(textPtr)
{
}